

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void do_cmd_knowledge_monsters(char *name,wchar_t row)

{
  monster_base **ppmVar1;
  wchar_t wVar2;
  group_funcs g_funcs;
  monster_race *pmVar3;
  monster_race *pmVar4;
  wchar_t wVar5;
  join_t *pjVar6;
  _Bool _Var7;
  wchar_t o_count;
  int *obj_list;
  wchar_t wVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  wchar_t wVar13;
  bool bVar14;
  group_funcs r_funcs;
  
  wVar5 = n_monster_group;
  o_count = count_known_monsters();
  default_join = (join_t *)mem_zalloc((long)o_count * 8);
  obj_list = (int *)mem_zalloc((long)o_count << 2);
  uVar12 = 0;
  wVar13 = L'\0';
  do {
    pmVar4 = r_info;
    if (z_info->r_max <= uVar12) {
      uVar12 = CONCAT44(r_funcs._36_4_,wVar5) & 0xffffff00ffffffff;
      g_funcs.gcomp = m_cmp_race;
      g_funcs.name = race_name;
      g_funcs.group = default_group_id;
      g_funcs.summary = mon_summary;
      g_funcs.maxnum = (int)uVar12;
      g_funcs.easy_know = (_Bool)(char)(uVar12 >> 0x20);
      g_funcs._37_3_ = (int3)(uVar12 >> 0x28);
      display_knowledge("monsters",obj_list,o_count,g_funcs,
                        (member_funcs)
                        ZEXT4056(CONCAT832(recall_prompt,
                                           CONCAT824(m_xattr,CONCAT816(m_xchar,CONCAT88(mon_lore,
                                                  display_monster))))),
                        "                   Sym  Kills");
      mem_free(default_join);
      mem_free(obj_list);
      return;
    }
    if (((l_list[uVar12].all_known != false) || (l_list[uVar12].sights != 0)) &&
       (r_info[uVar12].name != (char *)0x0)) {
      pmVar3 = r_info + uVar12;
      lVar9 = 0;
      bVar14 = false;
      wVar8 = n_monster_group;
      while( true ) {
        if (wVar8 + L'\xffffffff' <= lVar9) break;
        wVar2 = monster_group[lVar9].n_inc_bases;
        if (wVar2 == L'\0') {
LAB_001c9e91:
          _Var7 = flag_is_inter(pmVar3->flags,monster_group[lVar9].inc_flags,0xb);
          wVar8 = n_monster_group;
          if (_Var7) {
            if (o_count <= wVar13) {
              __assert_fail("ind < m_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                            ,0x54c,"void do_cmd_knowledge_monsters(const char *, int)");
            }
            goto LAB_001c9eb9;
          }
        }
        else {
          uVar10 = (ulong)(uint)wVar2;
          if (wVar2 < L'\x01') {
            uVar10 = 0;
          }
          uVar11 = 0;
          do {
            if (uVar10 == uVar11) goto LAB_001c9e91;
            ppmVar1 = monster_group[lVar9].inc_bases + uVar11;
            uVar11 = uVar11 + 1;
          } while (pmVar4[uVar12].base != *ppmVar1);
          if (o_count <= wVar13) {
            __assert_fail("ind < m_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                          ,0x53f,"void do_cmd_knowledge_monsters(const char *, int)");
          }
LAB_001c9eb9:
          obj_list[wVar13] = wVar13;
          pjVar6 = default_join;
          default_join[wVar13].oid = (wchar_t)uVar12;
          pjVar6[wVar13].gid = (wchar_t)lVar9;
          wVar13 = wVar13 + L'\x01';
          bVar14 = true;
        }
        lVar9 = lVar9 + 1;
      }
      if (!bVar14) {
        if (o_count <= wVar13) {
          __assert_fail("ind < m_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                        ,0x556,"void do_cmd_knowledge_monsters(const char *, int)");
        }
        obj_list[wVar13] = wVar13;
        pjVar6 = default_join;
        default_join[wVar13].oid = (wchar_t)uVar12;
        pjVar6[wVar13].gid = wVar8 + L'\xffffffff';
        wVar13 = wVar13 + L'\x01';
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static void do_cmd_knowledge_monsters(const char *name, int row)
{
	group_funcs r_funcs = {race_name, m_cmp_race, default_group_id,
		mon_summary, n_monster_group, false };

	member_funcs m_funcs = {display_monster, mon_lore, m_xchar, m_xattr,
		recall_prompt, 0, 0};

	int *monsters;
	int m_count = count_known_monsters(), i, ind;

	default_join = mem_zalloc(m_count * sizeof(join_t));
	monsters = mem_zalloc(m_count * sizeof(int));

	ind = 0;
	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						assert(ind < m_count);
						monsters[ind] = ind;
						default_join[ind].oid = i;
						default_join[ind].gid = j;
						++ind;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				assert(ind < m_count);
				monsters[ind] = ind;
				default_join[ind].oid = i;
				default_join[ind].gid = j;
				++ind;
				classified = true;
			}
		}

		if (!classified) {
			assert(ind < m_count);
			monsters[ind] = ind;
			default_join[ind].oid = i;
			default_join[ind].gid = n_monster_group - 1;
			++ind;
		}
	}

	display_knowledge("monsters", monsters, m_count, r_funcs, m_funcs,
			"                   Sym  Kills");
	mem_free(default_join);
	mem_free(monsters);
}